

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteCamerasLibrary(ColladaExporter *this)

{
  bool bVar1;
  ostream *poVar2;
  ulong local_18;
  size_t a;
  ColladaExporter *this_local;
  
  bVar1 = aiScene::HasCameras(this->mScene);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"<library_cameras>");
    std::operator<<(poVar2,(string *)&this->endstr);
    PushTag(this);
    for (local_18 = 0; local_18 < this->mScene->mNumCameras; local_18 = local_18 + 1) {
      WriteCamera(this,local_18);
    }
    PopTag(this);
    poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar2 = std::operator<<(poVar2,"</library_cameras>");
    std::operator<<(poVar2,(string *)&this->endstr);
  }
  return;
}

Assistant:

void ColladaExporter::WriteCamerasLibrary() {
    if(mScene->HasCameras()) {

        mOutput << startstr << "<library_cameras>" << endstr;
        PushTag();

        for( size_t a = 0; a < mScene->mNumCameras; ++a)
            WriteCamera( a);

        PopTag();
        mOutput << startstr << "</library_cameras>" << endstr;

    }
}